

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmac.cpp
# Opt level: O2

void VHASH_PADDED_32(void *key,int len,uint32_t seed,void *res)

{
  uint64_t uVar1;
  undefined4 in_register_00000014;
  uint64_t *tagl;
  uint64_t *extraout_RDX;
  uint mbytes;
  uint uVar2;
  
  tagl = (uint64_t *)CONCAT44(in_register_00000014,seed);
  uVar2 = len & 0xf;
  if (uVar2 != 0) {
    mbytes = (len / 0x80) * 0x80;
    if (0xfe < len + 0x7fU) {
      vhash_update((uchar *)key,mbytes,&vhi.ctx);
    }
    len = len % 0x80;
    memcpy(vhi.aligned16Buff,(void *)((long)key + (long)(int)mbytes),(long)len);
    memset(vhi.aligned16Buff + len,0,(ulong)(0x10 - uVar2));
    tagl = extraout_RDX;
    key = vhi.aligned16Buff;
  }
  uVar1 = vhash((uchar *)key,len,tagl,&vhi.ctx);
  *(int *)res = (int)uVar1;
  return;
}

Assistant:

void VHASH_PADDED_32(const void * key, int len, uint32_t seed, void * res)
{
	(void)seed; //unused
#ifdef __arm__
	if ((((uintptr_t)key) & 0xF) == 0) // aligned in memory
	{
#endif // __arm__
		if (len & 0xF) // size is not a multiple of 16
		{
			int blcCnt = len / VMAC_NHBYTES;
			int alignedLn = blcCnt * VMAC_NHBYTES;

			if (alignedLn)
				vhash_update((unsigned char*)key, alignedLn, &(vhi.ctx));
//			ALIGN(16) unsigned char lastBlock[VMAC_NHBYTES + 16];
			int bytesRemaining = len - alignedLn;
			memcpy(vhi.aligned16Buff, (unsigned char*)key + alignedLn, bytesRemaining);
			int bytesRemaining16aligned = ( ( bytesRemaining >> 4) << 4 ) + 16;
			memset(vhi.aligned16Buff + bytesRemaining, 0, bytesRemaining16aligned - bytesRemaining);

			uint64_t tagl;
#if (VMAC_TAG_LEN == 128)
			*(uint32_t*)res = vhash(vhi.aligned16Buff, bytesRemaining, &tagl, &(vhi.ctx));
#elif (VMAC_TAG_LEN == 64)
			*(uint32_t*)res = vhash(vhi.aligned16Buff, bytesRemaining, &tagl, &(vhi.ctx));
#else
#error VMAC_TAG_LEN could be either 64 or 128
#endif
		}
		else // size is a multiple of 16
		{
			uint64_t tagl;
#if (VMAC_TAG_LEN == 128)
			*(uint32_t*)res = vhash((unsigned char *)key, len, &tagl, &(vhi.ctx));
#elif (VMAC_TAG_LEN == 64)
			*(uint32_t*)res = vhash((unsigned char *)key, len, &tagl, &(vhi.ctx));
#else
#error VMAC_TAG_LEN could be either 64 or 128
#endif
		}
#ifdef __arm__
	}
	else // unaligned data
	{
		unsigned char * buffAligned;
		unsigned char * buff = NULL;
		{
			if ( len < VHASH_initializer::MAX_BUFF_LN )
				buffAligned = vhi.aligned16Buff;
			else
			{
				buff = new unsigned char[ len + 128 ];
				buffAligned = (unsigned char*)( ( ( ( size_t(buff) ) >> 4 ) << 4 )  + 16 );
			}
			memcpy( buffAligned, key, len );
			memset( buffAligned + len, 0, 16 );
		}


		uint64_t tagl;
#if (VMAC_TAG_LEN == 128)
		*(uint32_t*)res = (uint32_t)vhash( (unsigned char *)buffAligned, len, &tagl, &(vhi.ctx) );
#elif (VMAC_TAG_LEN == 64)
		*(uint32_t*)res = (uint32_t)vhash( (unsigned char *)buffAligned, len, &tagl, &(vhi.ctx) );
#else
#error VMAC_TAG_LEN could be either 64 or 128
#endif


		if ( buff != NULL ) delete [] buff;
	}
#endif // __arm__
	//	vhash_abort(&(vhi.ctx));
}